

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

int subprocess::util::write_n(int fd,char *buf,size_t length)

{
  long lVar1;
  ssize_t sVar2;
  ulong in_RDX;
  long in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int written;
  size_t nwritten;
  undefined8 local_28;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  do {
    if (in_RDX <= local_28) {
      local_c = (int)local_28;
LAB_00f7eea1:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_c;
      }
      __stack_chk_fail();
    }
    sVar2 = ::write(in_EDI,(void *)(in_RSI + local_28),in_RDX - local_28);
    if ((int)sVar2 == -1) {
      local_c = -1;
      goto LAB_00f7eea1;
    }
    local_28 = (long)(int)sVar2 + local_28;
  } while( true );
}

Assistant:

static inline
  int write_n(int fd, const char* buf, size_t length)
  {
    size_t nwritten = 0;
    while (nwritten < length) {
      int written = write(fd, buf + nwritten, length - nwritten);
      if (written == -1) return -1;
      nwritten += written;
    }
    return nwritten;
  }